

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.hpp
# Opt level: O1

void __thiscall duckdb::RemoveFieldInfo::RemoveFieldInfo(RemoveFieldInfo *this)

{
  *(undefined2 *)&(this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo.info_type = 0x100;
  (this->super_AlterTableInfo).super_AlterInfo.catalog._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.catalog.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.catalog._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.catalog.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.schema._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.schema.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.schema._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.schema.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.name._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.name.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.name._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.name.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.field_0x71 = 0xf;
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__RemoveFieldInfo_02491f30;
  (this->column_path).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_path).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_path).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit ParseInfo(ParseInfoType info_type) : info_type(info_type) {
	}